

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O3

bool duckdb::Prefix::Traverse
               (ART *art,reference<Node> *l_node,reference<Node> *r_node,idx_t *pos,
               GateStatus status)

{
  byte bVar1;
  byte bVar2;
  Node *pNVar3;
  bool bVar4;
  idx_t iVar5;
  Prefix r_prefix;
  Node r_child;
  Prefix l_prefix;
  Prefix local_68;
  IndexPointer local_50;
  Prefix local_48;
  
  Prefix(&local_48,art,(Node)(l_node->_M_data->super_IndexPointer).data,true,false);
  Prefix(&local_68,art,(Node)(r_node->_M_data->super_IndexPointer).data,true,false);
  bVar1 = art->prefix_count;
  bVar2 = local_68.data[bVar1];
  if (local_48.data[bVar1] < local_68.data[bVar1]) {
    bVar2 = local_48.data[bVar1];
  }
  if (bVar2 != 0) {
    iVar5 = 0;
    do {
      if (local_48.data[iVar5] != local_68.data[iVar5]) {
        *pos = iVar5;
        goto LAB_015a294f;
      }
      iVar5 = iVar5 + 1;
    } while (bVar2 != iVar5);
  }
  *pos = 0xffffffffffffffff;
  if (local_48.data[bVar1] == local_68.data[bVar1]) {
    local_50.data = ((local_68.ptr)->super_IndexPointer).data;
    ((local_68.ptr)->super_IndexPointer).data = 0;
    Node::Free(art,r_node->_M_data);
    bVar4 = Node::MergeInternal(local_48.ptr,art,(Node *)&local_50,status);
  }
  else {
    *pos = (ulong)bVar2;
    if (((((local_68.ptr)->super_IndexPointer).data & 0x7f00000000000000) != 0x100000000000000) &&
       (local_68.data[bVar1] == bVar2)) {
      pNVar3 = r_node->_M_data;
      iVar5 = (l_node->_M_data->super_IndexPointer).data;
      (l_node->_M_data->super_IndexPointer).data = (pNVar3->super_IndexPointer).data;
      (pNVar3->super_IndexPointer).data = iVar5;
      local_48.ptr = local_68.ptr;
    }
    l_node->_M_data = local_48.ptr;
LAB_015a294f:
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool Prefix::Traverse(ART &art, reference<Node> &l_node, reference<Node> &r_node, idx_t &pos, const GateStatus status) {
	D_ASSERT(l_node.get().HasMetadata());
	D_ASSERT(r_node.get().HasMetadata());

	Prefix l_prefix(art, l_node, true);
	Prefix r_prefix(art, r_node, true);

	idx_t max_count = MinValue(l_prefix.data[Count(art)], r_prefix.data[Count(art)]);
	pos = GetMismatchWithOther(l_prefix, r_prefix, max_count);
	if (pos != DConstants::INVALID_INDEX) {
		return true;
	}

	// Match.
	if (l_prefix.data[Count(art)] == r_prefix.data[Count(art)]) {
		auto r_child = *r_prefix.ptr;
		r_prefix.ptr->Clear();
		Node::Free(art, r_node);
		return l_prefix.ptr->MergeInternal(art, r_child, status);
	}

	pos = max_count;
	if (r_prefix.ptr->GetType() != PREFIX && r_prefix.data[Count(art)] == max_count) {
		// l_prefix contains r_prefix.
		swap(l_node.get(), r_node.get());
		l_node = *r_prefix.ptr;
		return true;
	}
	// r_prefix contains l_prefix.
	l_node = *l_prefix.ptr;
	return true;
}